

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void SHUFF_OUTPUT_BIT(bit_io_t *bio,int64_t b)

{
  long in_RSI;
  bit_io_t *in_RDI;
  
  *in_RDI->out_u64 = *in_RDI->out_u64 << 1;
  if (in_RSI != 0) {
    *in_RDI->out_u64 = *in_RDI->out_u64 | 1;
  }
  in_RDI->buff_btg = in_RDI->buff_btg - 1;
  if (in_RDI->buff_btg == 0) {
    SHUFF_OUTPUT_NEXT(in_RDI);
    *in_RDI->out_u64 = 0;
    in_RDI->buff_btg = 0x40;
  }
  return;
}

Assistant:

inline void SHUFF_OUTPUT_BIT(bit_io_t* bio, int64_t b)
{
    *bio->out_u64 <<= 1;
    if (b)
        *bio->out_u64 |= 1;
    bio->buff_btg--;
    if (bio->buff_btg == 0) {
        SHUFF_OUTPUT_NEXT(bio);
        *bio->out_u64 = 0;
        bio->buff_btg = SHUFF_BUFF_BITS;
    }
}